

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoder_base_construct
          (LossyDctEncoder *e,float quantBaseError,uint8_t *packedAc,uint8_t *packedDc,
          uint16_t *toNonlinear,int width,int height)

{
  uint16_t uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  int idx;
  int jpegQuantTableCbCrMin;
  int jpegQuantTableCbCr [64];
  int jpegQuantTableYMin;
  int jpegQuantTableY [64];
  int local_250;
  int local_248 [67];
  int local_13c;
  int local_138 [66];
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  memcpy(local_138,&DAT_001a11e0,0x100);
  local_13c = 10;
  memcpy(local_248,&DAT_001a12e0,0x100);
  *(undefined4 *)((long)local_8 + 0x3c) = local_c;
  *(undefined4 *)((long)local_8 + 0x34) = local_2c;
  *(undefined4 *)(local_8 + 7) = local_30;
  *local_8 = local_28;
  local_8[1] = 0;
  local_8[2] = 0;
  local_8[8] = local_18;
  local_8[9] = local_20;
  if (*(float *)((long)local_8 + 0x3c) <= 0.0 && *(float *)((long)local_8 + 0x3c) != 0.0) {
    *(undefined4 *)((long)local_8 + 0x3c) = 0;
  }
  for (local_250 = 0; local_250 < 0x40; local_250 = local_250 + 1) {
    *(float *)((long)local_8 + (long)local_250 * 4 + 0x50) =
         (*(float *)((long)local_8 + 0x3c) * (float)local_138[local_250]) / (float)local_13c;
    uVar1 = float_to_half(0.0);
    *(uint16_t *)((long)local_8 + (long)local_250 * 2 + 0x150) = uVar1;
    *(float *)((long)local_8 + (long)local_250 * 4 + 0x1d0) =
         (*(float *)((long)local_8 + 0x3c) * (float)local_248[local_250]) / 17.0;
    uVar1 = float_to_half(0.0);
    *(uint16_t *)((long)local_8 + (long)local_250 * 2 + 0x2d0) = uVar1;
  }
  local_8[3] = 0;
  local_8[4] = 0;
  local_8[5] = 0;
  *(undefined4 *)(local_8 + 6) = 0;
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_base_construct (
    LossyDctEncoder* e,
    float            quantBaseError,
    uint8_t*         packedAc,
    uint8_t*         packedDc,
    const uint16_t*  toNonlinear,
    int              width,
    int              height)
{
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use static quantization tables.
    //
    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    e->_quantBaseError = quantBaseError;
    e->_width          = width;
    e->_height         = height;
    e->_toNonlinear    = toNonlinear;
    e->_numAcComp      = 0;
    e->_numDcComp      = 0;
    e->_packedAc       = packedAc;
    e->_packedDc       = packedDc;
    if (e->_quantBaseError < 0) e->_quantBaseError = 0;

    for (int idx = 0; idx < 64; ++idx)
    {
        e->_quantTableY[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableY[idx]) /
             (float) (jpegQuantTableYMin));
        e->_hquantTableY[idx] = float_to_half (e->_quantTableY[idx]);

        e->_quantTableCbCr[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableCbCr[idx]) /
             (float) (jpegQuantTableCbCrMin));
        e->_hquantTableCbCr[idx] = float_to_half (e->_quantTableCbCr[idx]);
    }

    e->_channel_encode_data[0]    = NULL;
    e->_channel_encode_data[1]    = NULL;
    e->_channel_encode_data[2]    = NULL;
    e->_channel_encode_data_count = 0;

    return EXR_ERR_SUCCESS;
}